

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::formatFuncDetailValue
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,Value value)

{
  byte bVar1;
  uint uVar2;
  Error EVar3;
  char *str;
  
  if (value._value < 0x1000000) {
    str = "void";
  }
  else {
    uVar2 = value._value >> 0x18;
    if (uVar2 - 0x20 < 0x45) {
      if ((int)value._value < 0) {
        formatFuncDetailValue();
LAB_0015d048:
        formatFuncDetailValue();
      }
      bVar1 = TypeId::_info[(ulong)uVar2 + 0x80];
      if ((byte)(bVar1 - 0x20) < 0x13) {
        str = &DAT_0016de14 + *(int *)(&DAT_0016de14 + (ulong)(byte)(bVar1 - 0x20) * 4);
      }
      else {
        str = "unknown";
      }
      if ((char)bVar1 < '\0') goto LAB_0015d048;
      if ((byte)TypeId::_info[bVar1] < (byte)TypeId::_info[uVar2]) {
        EVar3 = StringBuilder::appendFormat
                          (sb,"%sx%u",str,
                           (ulong)((byte)TypeId::_info[uVar2] / (byte)TypeId::_info[bVar1]));
        goto LAB_0015cfb5;
      }
    }
    else {
      str = "unknown";
    }
  }
  EVar3 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
LAB_0015cfb5:
  if (((EVar3 == 0) &&
      (((value._value >> 0x10 & 1) == 0 ||
       ((EVar3 = StringBuilder::_opChar(sb,1,':'), EVar3 == 0 &&
        (EVar3 = X86Logging::formatRegister
                           (sb,logOptions,emitter,
                            (uint)(emitter->_codeInfo)._archInfo.field_0.field_0._type,
                            value._value >> 8 & 0xff,value._value & 0xff), EVar3 == 0)))))) &&
     (((value._value >> 0x11 & 1) == 0 ||
      (EVar3 = StringBuilder::appendFormat(sb,":[%d]",(ulong)(value._value & 0xffff)), EVar3 == 0)))
     ) {
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

static Error formatFuncDetailValue(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  FuncDetail::Value value) noexcept {

  uint32_t typeId = value.getTypeId();
  ASMJIT_PROPAGATE(formatTypeId(sb, typeId));

  if (value.byReg()) {
    ASMJIT_PROPAGATE(sb.appendChar(':'));
    ASMJIT_PROPAGATE(Logging::formatRegister(sb, logOptions, emitter, emitter->getArchType(), value.getRegType(), value.getRegId()));
  }

  if (value.byStack()) {
    ASMJIT_PROPAGATE(sb.appendFormat(":[%d]", static_cast<int>(value.getStackOffset())));
  }

  return kErrorOk;
}